

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

void __thiscall
ExecutionEngine::populateMultiarray
          (ExecutionEngine *this,ArrayObject *array,ValueType valueType,
          stack<int,_std::deque<int,_std::allocator<int>_>_> *count)

{
  _Elt_pointer piVar1;
  size_type sVar2;
  anon_union_8_10_52016fac_for_data this_00;
  int iVar3;
  ValueType type;
  int iVar4;
  bool bVar5;
  Value value;
  Value value_00;
  _Deque_base<int,_std::allocator<int>_> local_80;
  
  piVar1 = (count->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_cur;
  if (piVar1 == (count->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar1 = (count->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_node[-1] + 0x80;
  }
  iVar4 = piVar1[-1];
  std::deque<int,_std::allocator<int>_>::pop_back(&count->c);
  sVar2 = std::deque<int,_std::allocator<int>_>::size(&count->c);
  type = REFERENCE;
  if (sVar2 < 2) {
    type = valueType;
  }
  sVar2 = std::deque<int,_std::allocator<int>_>::size(&count->c);
  if (sVar2 == 0) {
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
      value_00.data.longValue = 0;
      value_00._0_8_ = (ulong)valueType * 0x100000001;
      ArrayObject::pushValue(array,value_00);
    }
  }
  else {
    iVar3 = 0;
    if (0 < iVar4) {
      iVar3 = iVar4;
    }
    while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
      this_00.object = (Object *)operator_new(0x28);
      ArrayObject::ArrayObject((ArrayObject *)this_00.object,type);
      std::deque<int,_std::allocator<int>_>::deque
                ((deque<int,_std::allocator<int>_> *)&local_80,&count->c);
      populateMultiarray(this,(ArrayObject *)this_00.object,valueType,
                         (stack<int,_std::deque<int,_std::allocator<int>_>_> *)&local_80);
      std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_80);
      value.data.object = (Object *)this_00.longValue;
      value.printType = BOOLEAN;
      value.type = REFERENCE;
      ArrayObject::pushValue(array,value);
    }
  }
  return;
}

Assistant:

void ExecutionEngine::populateMultiarray(ArrayObject *array, ValueType valueType, stack<int> count) {
    int currCount = count.top();
    count.pop();
    
    ValueType arrayType = (count.size() > 1) ? ValueType::REFERENCE : valueType;
    
    if (count.size() == 0) {
        for (int i = 0; i < currCount; i++) {
            Value subarrayValue;
            subarrayValue.type = valueType;
            subarrayValue.printType = valueType;
            subarrayValue.data.longValue = 0;
            array->pushValue(subarrayValue);
        }
    } else {
        for (int i = 0; i < currCount; i++) {
            ArrayObject *subarray = new ArrayObject(arrayType);
            populateMultiarray(subarray, valueType, count);
            
            Value subarrayValue;
            subarrayValue.type = ValueType::REFERENCE;
            subarrayValue.data.object = subarray;
            array->pushValue(subarrayValue);
        }
    }
}